

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

int __thiscall
JsUtil::
BaseDictionary<int,Js::PropertyGuard*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
::
Insert<(JsUtil::BaseDictionary<int,Js::PropertyGuard*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
          (BaseDictionary<int,Js::PropertyGuard*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
           *this,int *key,PropertyGuard **value)

{
  BaseDictionary<int,Js::PropertyGuard*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
  *pBVar1;
  hash_t hashCode;
  uint uVar2;
  PropertyGuard *pPVar3;
  long lVar4;
  code *pcVar5;
  bool bVar6;
  int iVar7;
  undefined4 *puVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  PropertyGuard *local_60;
  int *local_58;
  ulong local_50;
  long local_48;
  BaseDictionary<int,Js::PropertyGuard*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
  *local_40;
  uint local_34;
  
  lVar12 = *(long *)this;
  if (lVar12 == 0) {
    BaseDictionary<int,_Js::PropertyGuard_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::Initialize((BaseDictionary<int,_Js::PropertyGuard_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  *)this,0);
    lVar12 = *(long *)this;
  }
  hashCode = *key * 2 + 1;
  local_34 = BaseDictionary<int,_Js::PropertyGuard_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
             ::GetBucket(hashCode,*(int *)(this + 0x1c),*(int *)(this + 0x2c));
  uVar10 = *(uint *)(lVar12 + (ulong)local_34 * 4);
  if ((int)uVar10 < 0) {
    uVar11 = 0;
  }
  else {
    uVar11 = 0;
    do {
      if (*(int *)(*(long *)(this + 8) + 0xc + (ulong)uVar10 * 0x10) == *key) {
        if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
          DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),uVar11);
        }
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                           ,0x3b2,"(op != Insert_Add)","op != Insert_Add");
        if (bVar6) {
          *puVar8 = 0;
          return -1;
        }
        goto LAB_0060c8ec;
      }
      uVar11 = uVar11 + 1;
      uVar10 = *(uint *)((ulong)uVar10 * 0x10 + *(long *)(this + 8) + 8);
    } while (-1 < (int)uVar10);
  }
  if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),uVar11);
  }
  local_58 = key;
  if (*(int *)(this + 0x28) == 0) {
    uVar10 = *(uint *)(this + 0x18);
    uVar2 = *(uint *)(this + 0x20);
    if (uVar2 == uVar10) {
      BaseDictionary<int,_Js::PropertyGuard_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::Resize((BaseDictionary<int,_Js::PropertyGuard_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                *)this);
      local_34 = BaseDictionary<int,_Js::PropertyGuard_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 ::GetBucket(hashCode,*(int *)(this + 0x1c),*(int *)(this + 0x2c));
      uVar10 = *(uint *)(this + 0x18);
      uVar2 = *(uint *)(this + 0x20);
    }
    uVar9 = (ulong)uVar2;
    *(uint *)(this + 0x20) = uVar2 + 1;
    if ((int)uVar10 < (int)(uVar2 + 1)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3f1,"(count <= size)","count <= size");
      if (!bVar6) goto LAB_0060c8ec;
      *puVar8 = 0;
      uVar10 = *(uint *)(this + 0x18);
    }
    if ((int)uVar10 <= (int)uVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3f2,"(index < size)","index < size");
      if (!bVar6) goto LAB_0060c8ec;
      *puVar8 = 0;
    }
  }
  else {
    if (*(int *)(this + 0x28) < 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3d4,"(freeCount > 0)","freeCount > 0");
      if (!bVar6) goto LAB_0060c8ec;
      *puVar8 = 0;
    }
    uVar10 = *(uint *)(this + 0x24);
    if ((int)uVar10 < 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3d5,"(freeList >= 0)","freeList >= 0");
      if (!bVar6) goto LAB_0060c8ec;
      *puVar8 = 0;
      uVar10 = *(uint *)(this + 0x24);
    }
    if (*(int *)(this + 0x20) <= (int)uVar10) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3d6,"(freeList < count)","freeList < count");
      if (!bVar6) {
LAB_0060c8ec:
        pcVar5 = (code *)invalidInstructionException();
        (*pcVar5)();
      }
      *puVar8 = 0;
      uVar10 = *(uint *)(this + 0x24);
    }
    uVar9 = (ulong)uVar10;
    pBVar1 = this + 0x28;
    *(int *)pBVar1 = *(int *)pBVar1 + -1;
    if (*(int *)pBVar1 != 0) {
      iVar7 = BaseDictionary<int,_Js::PropertyGuard_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::GetNextFreeEntryIndex((EntryType *)((long)(int)uVar10 * 0x10 + *(long *)(this + 8)))
      ;
      *(int *)(this + 0x24) = iVar7;
    }
  }
  lVar12 = *(long *)(this + 8);
  local_48 = (long)(int)uVar9;
  lVar13 = local_48 * 0x10;
  pPVar3 = *value;
  local_50 = uVar9;
  local_40 = this;
  Memory::Recycler::WBSetBit((char *)&local_60);
  local_60 = pPVar3;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_60);
  pPVar3 = local_60;
  Memory::Recycler::WBSetBit((char *)(lVar12 + lVar13));
  *(PropertyGuard **)(lVar12 + lVar13) = pPVar3;
  Memory::RecyclerWriteBarrierManager::WriteBarrier((char *)(lVar12 + lVar13));
  *(int *)(lVar12 + 0xc + lVar13) = *local_58;
  lVar12 = *(long *)local_40;
  lVar4 = *(long *)(local_40 + 8);
  *(undefined4 *)(lVar4 + 8 + lVar13) = *(undefined4 *)(lVar12 + (ulong)local_34 * 4);
  iVar7 = (int)local_50;
  *(int *)(lVar12 + (ulong)local_34 * 4) = (int)local_48;
  uVar11 = 0;
  uVar9 = local_50 & 0xffffffff;
  do {
    uVar10 = *(uint *)(lVar4 + 8 + (long)(int)uVar9 * 0x10);
    uVar9 = (ulong)uVar10;
    uVar11 = uVar11 + 1;
  } while (uVar10 != 0xffffffff);
  if (*(DictionaryStats **)(local_40 + 0x30) != (DictionaryStats *)0x0) {
    DictionaryStats::Insert(*(DictionaryStats **)(local_40 + 0x30),uVar11);
  }
  return iVar7;
}

Assistant:

int Insert(const TKey& key, const TValue& value)
        {
            int * localBuckets = buckets;
            if (localBuckets == nullptr)
            {
                Initialize(0);
                localBuckets = buckets;
            }

#if DBG || PROFILE_DICTIONARY
            // Always search and verify
            const bool needSearch = true;
#else
            const bool needSearch = (op != Insert_Add);
#endif
            hash_t hashCode = GetHashCode(key);
            uint targetBucket = this->GetBucket(hashCode);
            if (needSearch)
            {
#if PROFILE_DICTIONARY
                uint depth = 0;
#endif
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket]; i >= 0; i = localEntries[i].next)
                {
                    if (localEntries[i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        Assert(op != Insert_Add);
                        if (op == Insert_Item)
                        {
                            localEntries[i].SetValue(value);
                            return i;
                        }
                        return -1;
                    }
#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }

#if PROFILE_DICTIONARY
                if (stats)
                    stats->Lookup(depth);
#endif
            }

            // Ideally we'd do cleanup only if weak references have been collected since the last resize
            // but that would require us to use an additional field to store the last recycler cleanup id
            // that we saw
            // We can add that optimization later if we have to.
            if (EntryType::SupportsCleanup() && freeCount == 0 && count == size)
            {
                this->MapAndRemoveIf([](EntryType& entry)
                {
                    return EntryType::NeedsCleanup(entry);
                });
            }

            int index;
            if (freeCount != 0)
            {
                Assert(freeCount > 0);
                Assert(freeList >= 0);
                Assert(freeList < count);
                index = freeList;
                freeCount--;
                if(freeCount != 0)
                {
                    freeList = GetNextFreeEntryIndex(entries[index]);
                }
            }
            else
            {
                // If there's nothing free, then in general, we set index to count, and increment count
                // If we resize, we also need to recalculate the target
                // However, if cleanup is supported, then before resize, we should try and clean up and see
                // if something got freed, and if it did, reuse that index
                if (count == size)
                {
                    Resize();
                    targetBucket = this->GetBucket(hashCode);
                    index = count;
                    count++;
                }
                else
                {
                    index = count;
                    count++;
                }

                Assert(count <= size);
                Assert(index < size);
            }

            entries[index].Set(key, value, hashCode);
            entries[index].next = buckets[targetBucket];
            buckets[targetBucket] = index;

#if PROFILE_DICTIONARY
            int profileIndex = index;
            uint depth = 1;  // need to recalculate depth in case there was a resize (also 1-based for stats->Insert)
            while(entries[profileIndex].next != -1)
            {
                profileIndex = entries[profileIndex].next;
                ++depth;
            }
            if (stats)
                stats->Insert(depth);
#endif
            return index;
        }